

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  byte *pbVar1;
  _typeobject *p_Var2;
  ulong uVar3;
  key_type **pppcVar4;
  handle hVar5;
  int iVar6;
  object *poVar7;
  long *plVar8;
  internals *piVar9;
  _Fwd_list_node_base *p_Var10;
  size_t sVar11;
  char *__dest;
  long lVar12;
  PyObject **ppPVar13;
  _heaptypeobject *p_Var14;
  handle *phVar15;
  error_already_set *this;
  PyObject *pPVar16;
  size_type *psVar17;
  object *object;
  PyTypeObject *pPVar18;
  PyTypeObject *type;
  tuple bases;
  object module_;
  object name;
  object qualname;
  handle local_140;
  handle local_138;
  allocator<char> local_129;
  handle local_128;
  accessor<pybind11::detail::accessor_policies::str_attr> local_120;
  handle local_100;
  handle local_f8;
  handle local_f0;
  long local_e8;
  PyObject local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [32];
  enable_if_t<_detail::is_pyobject<basic_string<char>_>::value_&&_detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_90;
  allocator<char> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_128.m_ptr = (PyObject *)PyUnicode_FromString(rec->name);
  local_100.m_ptr = local_128.m_ptr;
  handle::inc_ref(&local_100);
  pPVar16 = (rec->scope).m_ptr;
  if ((pPVar16 != (PyObject *)0x0) &&
     (pPVar18 = pPVar16->ob_type, pPVar18 != (PyTypeObject *)&PyModule_Type)) {
    iVar6 = PyType_IsSubtype(pPVar18,&PyModule_Type);
    if (iVar6 == 0) {
      iVar6 = PyObject_HasAttrString((rec->scope).m_ptr,"__qualname__");
      if (iVar6 == 1) {
        local_120.obj.m_ptr = (rec->scope).m_ptr;
        local_120.key = "__qualname__";
        local_120.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
        poVar7 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_120);
        local_f0.m_ptr =
             (PyObject *)PyUnicode_FromFormat("%U.%U",(poVar7->super_handle).m_ptr,local_128.m_ptr);
        pybind11::object::operator=((object *)&local_100,(object *)&local_f0);
        handle::dec_ref(&local_f0);
        handle::dec_ref(&local_120.cache.super_handle);
      }
    }
  }
  local_138.m_ptr = (PyObject *)0x0;
  pPVar16 = (rec->scope).m_ptr;
  if (pPVar16 != (PyObject *)0x0) {
    iVar6 = PyObject_HasAttrString(pPVar16,"__module__");
    if (iVar6 == 1) {
      local_120.obj.m_ptr = (rec->scope).m_ptr;
      local_120.key = "__module__";
      local_120.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar7 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_120);
      local_f0.m_ptr = (poVar7->super_handle).m_ptr;
      handle::inc_ref(&local_f0);
      pybind11::object::operator=((object *)&local_138,(object *)&local_f0);
      handle::dec_ref(&local_f0);
      handle::dec_ref(&local_120.cache.super_handle);
    }
    else {
      iVar6 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar6 == 1) {
        local_120.obj.m_ptr = (rec->scope).m_ptr;
        local_120.key = "__name__";
        local_120.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
        poVar7 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_120);
        local_f0.m_ptr = (poVar7->super_handle).m_ptr;
        handle::inc_ref(&local_f0);
        pybind11::object::operator=((object *)&local_138,(object *)&local_f0);
        handle::dec_ref(&local_f0);
        handle::dec_ref(&local_120.cache.super_handle);
      }
    }
  }
  hVar5.m_ptr = local_138.m_ptr;
  if (local_138.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,rec->name,(allocator<char> *)&local_f0);
  }
  else {
    str::str((str *)&local_f8,(object *)&local_138);
    cast<std::__cxx11::string>(&local_90,(pybind11 *)&local_f8,object);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0.m_ptr = &local_e0;
    pPVar16 = (PyObject *)(plVar8 + 2);
    if ((PyObject *)*plVar8 == pPVar16) {
      local_e0.ob_refcnt = pPVar16->ob_refcnt;
      local_e0.ob_type = (PyTypeObject *)plVar8[3];
    }
    else {
      local_e0.ob_refcnt = pPVar16->ob_refcnt;
      local_f0.m_ptr = (PyObject *)*plVar8;
    }
    local_e8 = plVar8[1];
    *plVar8 = (long)pPVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
    local_120._0_8_ = &local_120.key;
    p_Var10 = (_Fwd_list_node_base *)(plVar8 + 2);
    if ((_Fwd_list_node_base *)*plVar8 == p_Var10) {
      local_120.key = (key_type)p_Var10->_M_next;
      local_120.cache.super_handle.m_ptr = (handle)plVar8[3];
    }
    else {
      local_120.key = (key_type)p_Var10->_M_next;
      local_120._0_8_ = (_Fwd_list_node_base *)*plVar8;
    }
    local_120.obj.m_ptr = (PyObject *)plVar8[1];
    *plVar8 = (long)p_Var10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
  }
  piVar9 = get_internals();
  p_Var10 = (_Fwd_list_node_base *)operator_new(0x28);
  p_Var10->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var10[1]._M_next = p_Var10 + 3;
  pppcVar4 = (key_type **)&local_120.key;
  if ((key_type **)local_120._0_8_ == pppcVar4) {
    p_Var10[3]._M_next = (_Fwd_list_node_base *)local_120.key;
    p_Var10[4]._M_next = (_Fwd_list_node_base *)local_120.cache.super_handle.m_ptr;
  }
  else {
    p_Var10[1]._M_next = (_Fwd_list_node_base *)local_120._0_8_;
    p_Var10[3]._M_next = (_Fwd_list_node_base *)local_120.key;
  }
  p_Var10[2]._M_next = (_Fwd_list_node_base *)local_120.obj.m_ptr;
  local_120.obj.m_ptr = (PyObject *)0x0;
  local_120.key = (key_type)((ulong)local_120.key & 0xffffffffffffff00);
  p_Var10->_M_next =
       (piVar9->static_strings).
       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_head._M_next;
  (piVar9->static_strings).
  super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_head._M_next = p_Var10;
  p_Var10 = p_Var10[1]._M_next;
  local_120._0_8_ = pppcVar4;
  if (hVar5.m_ptr != (PyObject *)0x0) {
    if (local_f0.m_ptr != &local_e0) {
      operator_delete(local_f0.m_ptr,local_e0.ob_refcnt + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    handle::dec_ref(&local_f8);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (char *)0x0;
  }
  else {
    sVar11 = strlen(rec->doc);
    __dest = (char *)PyObject_Malloc(sVar11 + 1);
    memcpy(__dest,rec->doc,sVar11 + 1);
  }
  piVar9 = get_internals();
  tuple::tuple((tuple *)&local_140,&(rec->bases).super_object);
  lVar12 = PyTuple_Size(local_140.m_ptr);
  if (lVar12 == 0) {
    ppPVar13 = &piVar9->instance_base;
  }
  else {
    local_120.obj.m_ptr = local_140.m_ptr;
    local_120.key = (key_type)0x0;
    local_120.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    ppPVar13 = (PyObject **)
               accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&local_120);
  }
  p_Var2 = (_typeobject *)*ppPVar13;
  if (lVar12 != 0) {
    handle::dec_ref(&local_120.cache.super_handle);
  }
  pPVar18 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar18 == (PyTypeObject *)0x0) {
    pPVar18 = piVar9->default_metaclass;
  }
  p_Var14 = (_heaptypeobject *)(*pPVar18->tp_alloc)(pPVar18,0);
  hVar5.m_ptr = local_128.m_ptr;
  if (p_Var14 == (_heaptypeobject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,rec->name,local_70);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_b0._0_8_ = *plVar8;
    p_Var14 = (_heaptypeobject *)(plVar8 + 2);
    if ((_heaptypeobject *)local_b0._0_8_ == p_Var14) {
      local_b0._16_8_ = (p_Var14->ht_type).ob_base.ob_base.ob_refcnt;
      local_b0._24_8_ = plVar8[3];
      local_b0._0_8_ = (_heaptypeobject *)(local_b0 + 0x10);
    }
    else {
      local_b0._16_8_ = (p_Var14->ht_type).ob_base.ob_base.ob_refcnt;
    }
    local_b0._8_8_ = plVar8[1];
    *plVar8 = (long)p_Var14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    pybind11_fail((string *)local_b0);
  }
  local_128.m_ptr = (PyObject *)0x0;
  p_Var14->ht_name = hVar5.m_ptr;
  phVar15 = handle::inc_ref(&local_100);
  p_Var14->ht_qualname = phVar15->m_ptr;
  (p_Var14->ht_type).tp_name = (char *)p_Var10;
  (p_Var14->ht_type).tp_doc = __dest;
  (p_Var2->ob_base).ob_base.ob_refcnt = (p_Var2->ob_base).ob_base.ob_refcnt + 1;
  (p_Var14->ht_type).tp_base = p_Var2;
  (p_Var14->ht_type).tp_basicsize = 0x38;
  lVar12 = PyTuple_Size(local_140.m_ptr);
  hVar5.m_ptr = local_140.m_ptr;
  if (lVar12 != 0) {
    local_140.m_ptr = (PyObject *)0x0;
    (p_Var14->ht_type).tp_bases = hVar5.m_ptr;
  }
  (p_Var14->ht_type).tp_init = pybind11_object_init;
  (p_Var14->ht_type).tp_as_number = &p_Var14->as_number;
  (p_Var14->ht_type).tp_as_sequence = &p_Var14->as_sequence;
  (p_Var14->ht_type).tp_as_mapping = &p_Var14->as_mapping;
  (p_Var14->ht_type).tp_as_async = &p_Var14->as_async;
  uVar3 = (p_Var14->ht_type).tp_flags;
  (p_Var14->ht_type).tp_flags = uVar3 | 0x200;
  if ((rec->field_0x80 & 0x20) == 0) {
    (p_Var14->ht_type).tp_flags = uVar3 | 0x600;
  }
  if ((rec->field_0x80 & 2) != 0) {
    pbVar1 = (byte *)((long)&(p_Var14->ht_type).tp_flags + 1);
    *pbVar1 = *pbVar1 | 0x40;
    lVar12 = (p_Var14->ht_type).tp_basicsize;
    (p_Var14->ht_type).tp_dictoffset = lVar12;
    (p_Var14->ht_type).tp_basicsize = lVar12 + 8;
    (p_Var14->ht_type).tp_traverse = pybind11_traverse;
    (p_Var14->ht_type).tp_clear = pybind11_clear;
    (p_Var14->ht_type).tp_getset =
         (PyGetSetDef *)enable_dynamic_attributes(_heaptypeobject*)::getset;
  }
  if ((rec->field_0x80 & 4) != 0) {
    (p_Var14->ht_type).tp_as_buffer = &p_Var14->as_buffer;
    (p_Var14->as_buffer).bf_getbuffer = pybind11_getbuffer;
    (p_Var14->as_buffer).bf_releasebuffer = pybind11_releasebuffer;
  }
  if ((rec->custom_type_setup_callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_b0._0_8_ = p_Var14;
    (*(rec->custom_type_setup_callback)._M_invoker)
              ((_Any_data *)&rec->custom_type_setup_callback,(_heaptypeobject **)local_b0);
  }
  iVar6 = PyType_Ready(p_Var14);
  if (iVar6 < 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_70,rec->name,&local_129);
    plVar8 = (long *)std::__cxx11::string::append((char *)local_70);
    local_d0._M_dataplus._M_p = (pointer)*plVar8;
    psVar17 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar17) {
      local_d0.field_2._M_allocated_capacity = *psVar17;
      local_d0.field_2._8_8_ = plVar8[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar17;
    }
    local_d0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar17;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    error_string_abi_cxx11_();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &local_d0,&local_50);
    pybind11_fail((string *)local_b0);
  }
  if (((rec->field_0x80 & 2) != 0) && (((p_Var14->ht_type).tp_flags & 0x4000) == 0)) {
    __assert_fail("!rec.dynamic_attr || PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/class.h"
                  ,0x2df,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  pPVar16 = (rec->scope).m_ptr;
  if (pPVar16 == (PyObject *)0x0) {
    (p_Var14->ht_type).ob_base.ob_base.ob_refcnt = (p_Var14->ht_type).ob_base.ob_base.ob_refcnt + 1;
  }
  else {
    iVar6 = PyObject_SetAttrString(pPVar16,rec->name,p_Var14);
    if (iVar6 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x18);
      error_already_set::error_already_set(this);
      goto LAB_0013f8ba;
    }
  }
  if (local_138.m_ptr != (PyObject *)0x0) {
    iVar6 = PyObject_SetAttrString(p_Var14,"__module__");
    if (iVar6 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x18);
      error_already_set::error_already_set(this);
LAB_0013f8ba:
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  handle::dec_ref(&local_140);
  handle::dec_ref(&local_138);
  handle::dec_ref(&local_100);
  handle::dec_ref(&local_128);
  return (PyObject *)p_Var14;
}

Assistant:

inline PyObject *make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
    }

    object module_;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__")) {
            module_ = rec.scope.attr("__module__");
        } else if (hasattr(rec.scope, "__name__")) {
            module_ = rec.scope.attr("__name__");
        }
    }

    const auto *full_name = c_str(
#if !defined(PYPY_VERSION)
        module_ ? str(module_).cast<std::string>() + "." + rec.name :
#endif
                rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (Python will free this later on) */
        size_t size = std::strlen(rec.doc) + 1;
#if PY_VERSION_HEX >= 0x030D0000
        tp_doc = (char *) PyMem_MALLOC(size);
#else
        tp_doc = (char *) PyObject_MALLOC(size);
#endif
        std::memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto *base = (bases.empty()) ? internals.instance_base : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *metaclass
        = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr() : internals.default_metaclass;

    auto *heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type) {
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");
    }

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto *type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *) base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (!bases.empty()) {
        type->tp_bases = bases.release().ptr();
    }

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;
    type->tp_as_async = &heap_type->as_async;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_HEAPTYPE;
    if (!rec.is_final) {
        type->tp_flags |= Py_TPFLAGS_BASETYPE;
    }

    if (rec.dynamic_attr) {
        enable_dynamic_attributes(heap_type);
    }

    if (rec.buffer_protocol) {
        enable_buffer_protocol(heap_type);
    }

    if (rec.custom_type_setup_callback) {
        rec.custom_type_setup_callback(heap_type);
    }

    if (PyType_Ready(type) < 0) {
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed: " + error_string());
    }

    assert(!rec.dynamic_attr || PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope) {
        setattr(rec.scope, rec.name, (PyObject *) type);
    } else {
        Py_INCREF(type); // Keep it alive forever (reference leak)
    }

    if (module_) { // Needed by pydoc
        setattr((PyObject *) type, "__module__", module_);
    }

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}